

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::remove
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong extraout_RAX;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 local_1c;
  undefined1 local_1;
  
  local_1c = 0;
  do {
    uVar4 = local_1c;
    iVar2 = size(this);
    uVar3 = (ulong)uVar4;
    if (iVar2 <= (int)uVar4) {
      local_1 = 0;
LAB_001c06c0:
      return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
    }
    bVar1 = CSkins::CSkin::operator==
                      ((CSkin *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (CSkin *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      remove_index((array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *)
                   CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      local_1 = 1;
      uVar3 = extraout_RAX;
      goto LAB_001c06c0;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}